

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void cs::foreach_helper<cs::range_type,cs::numeric>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  element_type *peVar1;
  _Elt_pointer ppsVar2;
  bool bVar3;
  range_type *prVar4;
  _Elt_pointer ppsVar5;
  _Elt_pointer ppsVar6;
  scope_guard scope;
  range_iterator __begin0;
  range_iterator __end0;
  scope_guard sStack_158;
  _Map_pointer local_150;
  any local_148;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *local_140;
  anon_union_16_2_310e9938_for_data local_138;
  undefined1 local_128;
  anon_union_16_2_310e9938_for_data local_b8;
  undefined1 local_a8;
  anon_union_16_2_310e9938_for_data local_98;
  undefined1 local_88;
  numeric_integer local_78;
  undefined8 uStack_70;
  undefined1 local_68;
  anon_union_16_2_310e9938_for_data local_58;
  undefined1 local_48;
  
  local_140 = body;
  prVar4 = cs_impl::any::const_val<cs::range_type>(obj);
  bVar3 = range_type::empty(prVar4);
  if (!bVar3) {
    peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1->break_block == true) {
      peVar1->break_block = false;
    }
    if (peVar1->continue_block == true) {
      peVar1->continue_block = false;
    }
    scope_guard::scope_guard(&sStack_158,context);
    prVar4 = cs_impl::any::const_val<cs::range_type>(obj);
    local_b8._int = (prVar4->m_step).data._int;
    local_b8._8_8_ = *(undefined8 *)((long)&(prVar4->m_step).data + 8);
    local_a8 = (prVar4->m_step).type;
    local_98._int = (prVar4->m_start).data._int;
    local_98._8_8_ = *(undefined8 *)((long)&(prVar4->m_start).data + 8);
    local_88 = (prVar4->m_start).type;
    local_78 = (prVar4->m_step).data._int;
    uStack_70 = *(undefined8 *)((long)&(prVar4->m_step).data + 8);
    local_58._int = (prVar4->m_stop).data._int;
    local_58._8_8_ = *(undefined8 *)((long)&(prVar4->m_stop).data + 8);
    local_48 = (prVar4->m_stop).type;
    local_68 = local_a8;
    while( true ) {
      bVar3 = numeric::operator<((numeric *)&local_98,(numeric *)&local_58);
      if (!bVar3) break;
      local_138._int = local_98._int;
      local_138._8_8_ = local_98._8_8_;
      local_128 = local_88;
      process_context::poll_event((process_context *)current_process);
      peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      cs_impl::any::any<cs::numeric>(&local_148,(numeric *)&local_138);
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (&(peVar1->super_runtime_type).storage,iterator,&local_148);
      cs_impl::any::recycle(&local_148);
      ppsVar6 = (local_140->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      ppsVar5 = (local_140->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_last;
      local_150 = (local_140->
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      ppsVar2 = (local_140->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (ppsVar6 != ppsVar2) {
        statement_base::run(*ppsVar6);
        peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->instance).
                 super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1->return_fcall != false) goto LAB_00161960;
        if (peVar1->break_block == true) {
          peVar1->break_block = false;
          goto LAB_00161960;
        }
        if (peVar1->continue_block != false) {
          peVar1->continue_block = false;
          break;
        }
        ppsVar6 = ppsVar6 + 1;
        if (ppsVar6 == ppsVar5) {
          ppsVar6 = local_150[1];
          local_150 = local_150 + 1;
          ppsVar5 = ppsVar6 + 0x40;
        }
      }
      scope_guard::clear(&sStack_158);
      range_iterator::operator++((range_iterator *)&local_b8);
    }
LAB_00161960:
    scope_guard::~scope_guard(&sStack_158);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}